

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorWeighted.cpp
# Opt level: O1

void __thiscall AlphaVectorWeighted::BackProjectWeights(AlphaVectorWeighted *this)

{
  undefined1 auVar1 [16];
  _func_int *p_Var2;
  size_t __n;
  long lVar3;
  ulong uVar4;
  PlanningUnitMADPDiscrete *this_00;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  vector<double,_std::allocator<double>_> w;
  allocator_type local_59;
  vector<double,_std::allocator<double>_> local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  value_type_conflict3 local_38;
  undefined8 extraout_XMM0_Qb;
  
  p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
  this_00 = *(PlanningUnitMADPDiscrete **)
             (&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
  if (this_00 == (PlanningUnitMADPDiscrete *)0x0) {
    this_00 = *(PlanningUnitMADPDiscrete **)
               (&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
  }
  __n = PlanningUnitMADPDiscrete::GetNrStates(this_00);
  local_40 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&(this->super_AlphaVectorPOMDP).field_0x40;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_erase_at_end(local_40,*(pointer *)&(this->super_AlphaVectorPOMDP).field_0x40);
  p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
  lVar3 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
  if (lVar3 == 0) {
    lVar3 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
  }
  lVar3 = (**(code **)(**(long **)(lVar3 + 0x30) + 0x68))();
  if (lVar3 != 0) {
    uVar5 = 0;
    do {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::vector(&local_58,__n,&local_38,&local_59);
      if (__n != 0) {
        uVar4 = 0;
        do {
          uVar7 = 1;
          uVar6 = 0;
          do {
            p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
            lVar3 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
            if (lVar3 == 0) {
              lVar3 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
            }
            auVar8._0_8_ = (**(code **)(**(long **)(lVar3 + 0x30) + 0x108))
                                     (*(long **)(lVar3 + 0x30),uVar4,uVar5,uVar7 - 1);
            auVar8._8_8_ = extraout_XMM0_Qb;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = *(ulong *)(*(long *)&(this->super_AlphaVectorPOMDP).field_0x28 +
                                     uVar6 * 8);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar4];
            auVar1 = vfmadd213sd_fma(auVar9,auVar8,auVar1);
            local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] = auVar1._0_8_;
            uVar6 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
          } while (__n != uVar6);
          uVar4 = (ulong)((int)uVar4 + 1);
        } while (__n != uVar4);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(local_40,&local_58);
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var2 = (this->super_AlphaVectorPOMDP)._vptr_AlphaVectorPOMDP[-3];
      lVar3 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x10 + (long)p_Var2);
      if (lVar3 == 0) {
        lVar3 = *(long *)(&(this->super_AlphaVectorPOMDP).field_0x18 + (long)p_Var2);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      uVar4 = (**(code **)(**(long **)(lVar3 + 0x30) + 0x68))();
    } while (uVar4 != uVar5);
  }
  (this->super_AlphaVectorPOMDP).field_0x20 = 1;
  return;
}

Assistant:

void AlphaVectorWeighted::BackProjectWeights()
{
    size_t nrS=GetPU()->GetNrStates();

    _m_weightsBackProjected.clear();
    for(Index ja=0;ja!=GetPU()->GetNrJointActions();++ja)
    {
        vector<double> w(nrS,0);
        for(Index s0=0;s0!=nrS;++s0)
            for(Index s1=0;s1!=nrS;++s1)
                w[s0]+=GetPU()->GetTransitionProbability(s0,ja,s1)*
                    _m_weights[s1];

        _m_weightsBackProjected.push_back(w);
    }

    _m_initialized=true;
}